

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh_asn1.cc
# Opt level: O0

int dh_param_copy(EVP_PKEY *to,EVP_PKEY *from)

{
  DH *dh_00;
  int iVar1;
  BIGNUM *a;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *local_50;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p;
  BIGNUM *q_old;
  DH *dh;
  EVP_PKEY *from_local;
  EVP_PKEY *to_local;
  
  iVar1 = dh_param_missing(from);
  if (iVar1 == 0) {
    dh_00 = (DH *)from->pkey;
    a = (BIGNUM *)DH_get0_q(dh_00);
    pBVar2 = (BIGNUM *)DH_get0_p(dh_00);
    pBVar2 = BN_dup(pBVar2);
    if (a == (BIGNUM *)0x0) {
      local_50 = (BIGNUM *)0x0;
    }
    else {
      local_50 = BN_dup(a);
    }
    pBVar3 = (BIGNUM *)DH_get0_g(dh_00);
    pBVar3 = BN_dup(pBVar3);
    if (((pBVar2 != (BIGNUM *)0x0) &&
        (((a == (BIGNUM *)0x0 || (local_50 != (BIGNUM *)0x0)) && (pBVar3 != (BIGNUM *)0x0)))) &&
       (iVar1 = DH_set0_pqg((DH *)to->pkey,(BIGNUM *)pBVar2,(BIGNUM *)local_50,(BIGNUM *)pBVar3),
       iVar1 != 0)) {
      return 1;
    }
    BN_free(pBVar2);
    BN_free(local_50);
    BN_free(pBVar3);
  }
  else {
    ERR_put_error(6,0,0x76,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh_asn1.cc"
                  ,0x2d);
  }
  return 0;
}

Assistant:

static int dh_param_copy(EVP_PKEY *to, const EVP_PKEY *from) {
  if (dh_param_missing(from)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }

  const DH *dh = reinterpret_cast<DH *>(from->pkey);
  const BIGNUM *q_old = DH_get0_q(dh);
  BIGNUM *p = BN_dup(DH_get0_p(dh));
  BIGNUM *q = q_old == NULL ? NULL : BN_dup(q_old);
  BIGNUM *g = BN_dup(DH_get0_g(dh));
  if (p == NULL || (q_old != NULL && q == NULL) || g == NULL ||
      !DH_set0_pqg(reinterpret_cast<DH *>(to->pkey), p, q, g)) {
    BN_free(p);
    BN_free(q);
    BN_free(g);
    return 0;
  }

  // |DH_set0_pqg| took ownership of |p|, |q|, and |g|.
  return 1;
}